

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

statement_list * __thiscall
mjs::parser::parse_statement_list
          (statement_list *__return_storage_ptr__,parser *this,bool check_for_strict_mode)

{
  token_type tVar1;
  byte bVar2;
  bool bVar3;
  pointer puVar4;
  element_type *local_30;
  
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  while ((tVar1 = (this->current_token_).type_, tVar1 != rbrace && (tVar1 != eof))) {
    bVar3 = this->strict_mode_;
    parse_statement((parser *)&stack0xffffffffffffffd0,SUB81(this,0));
    std::
    vector<std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>,std::allocator<std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>>>
    ::emplace_back<std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>>
              ((vector<std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>,std::allocator<std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>>>
                *)__return_storage_ptr__,
               (unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *)
               &stack0xffffffffffffffd0);
    if (local_30 != (element_type *)0x0) {
      (**(code **)(*(long *)local_30 + 8))();
    }
    if ((bVar3 == false) && (this->strict_mode_ == true)) {
      for (puVar4 = (__return_storage_ptr__->
                    super__Vector_base<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          puVar4 != (__return_storage_ptr__->
                    super__Vector_base<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish + -1; puVar4 = puVar4 + 1) {
        bVar3 = is_directive((puVar4->_M_t).
                             super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>
                             .super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl);
        if (!bVar3) {
          __assert_fail("is_directive(**it)",
                        "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.cpp"
                        ,0x305,"statement_list mjs::parser::parse_statement_list(bool)");
        }
        check_string_literal
                  (this,(source_extend *)
                        ((long)(puVar4->_M_t).
                               super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>
                               .super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl[1].
                               super_syntax_node._vptr_syntax_node + 8));
      }
    }
    bVar2 = check_for_strict_mode & 1;
    check_for_strict_mode = false;
    if (bVar2 != 0) {
      check_for_strict_mode =
           is_directive((__return_storage_ptr__->
                        super__Vector_base<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
                        super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>
                        .super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

statement_list parse_statement_list(bool check_for_strict_mode) {
        statement_list l;
        while (current_token() && current_token_type() != token_type::rbrace) {
            const bool strict_mode_active_before = strict_mode_;
            l.push_back(parse_statement(check_for_strict_mode));
            if (!strict_mode_active_before && strict_mode_) {
                // HACK: Strict mode was activated. Now go back and check the string literals before for octal escape sequences.
                for (auto it = l.begin(); it != l.end() - 1; ++it) {
                    assert(is_directive(**it));
                    check_string_literal(static_cast<const expression_statement&>(**it).e().extend());
                }
            }

            // Check if we're still in the directive prologue (ES5.1, 14.1)
            // which is an unbroken sequence of expression statements consisting of just a string literal
            if (check_for_strict_mode && !is_directive(*l.back())) {
                check_for_strict_mode = false;
            }
        }
        return l;
    }